

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demand_queue.hpp
# Opt level: O0

void __thiscall
so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_queue_t::~demand_queue_t
          (demand_queue_t *this)

{
  queue_for_one_priority_t *local_40;
  queue_for_one_priority_t *q;
  queue_for_one_priority_t *__end4;
  queue_for_one_priority_t *__begin4;
  queue_for_one_priority_t (*__range4) [8];
  demand_queue_t *this_local;
  
  for (__end4 = this->m_priorities; __end4 != (queue_for_one_priority_t *)&this->m_current_priority;
      __end4 = __end4 + 1) {
    cleanup_queue(this,__end4);
  }
  local_40 = (queue_for_one_priority_t *)&this->m_current_priority;
  do {
    local_40 = local_40 + -1;
    queue_for_one_priority_t::~queue_for_one_priority_t(local_40);
  } while (local_40 != this->m_priorities);
  std::
  unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
  ::~unique_ptr(&this->m_lock);
  return;
}

Assistant:

~demand_queue_t()
			{
				for( auto & q : m_priorities )
					cleanup_queue( q );
			}